

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSession.cpp
# Opt level: O2

void __thiscall ki::protocol::net::ClientSession::is_alive(ClientSession *this)

{
  is_alive((ClientSession *)((long)&this->_vptr_ClientSession + (long)this->_vptr_ClientSession[-4])
          );
  return;
}

Assistant:

bool ClientSession::is_alive() const
	{
		// If the session isn't established yet, use the time of
		// creation to decide whether this session is alive.
		if (!m_established)
			return std::chrono::duration_cast<std::chrono::seconds>(
				std::chrono::steady_clock::now() - m_creation_time
			).count() <= (KI_CONNECTION_TIMEOUT * 2);

		// Otherwise, use the last time we received a heartbeat.
		return std::chrono::duration_cast<std::chrono::seconds>(
			std::chrono::steady_clock::now() - m_last_received_heartbeat_time
		).count() <= (KI_SERVER_HEARTBEAT * 2);
	}